

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_model<_IO_FILE*,short,unsigned_int>
               (IsoForest *model,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  ushort uVar1;
  pointer pvVar2;
  pointer pIVar3;
  ScoringMetric SVar4;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  pointer this;
  IsoTree *node;
  pointer node_00;
  ulong uVar5;
  double data_doubles [2];
  size_t veclen;
  size_t data_sizets [2];
  
  if (!interrupt_switch) {
    if (lacks_range_penalty) {
      read_bytes<unsigned_char>(data_doubles,3,in);
      uVar1 = CONCAT11(data_doubles[0]._1_1_,data_doubles[0]._0_1_);
    }
    else {
      read_bytes<unsigned_char>(data_doubles,4,in);
      uVar1 = CONCAT11(data_doubles[0]._1_1_,data_doubles[0]._0_1_);
      model->has_range_penalty = data_doubles[0]._3_1_ != '\0';
    }
    uVar5 = (ulong)CONCAT14((char)(uVar1 >> 8),(uint)(uVar1 & 0xff));
    model->new_cat_action = (int)uVar5;
    model->cat_split_type = (int)(uVar5 >> 0x20);
    model->missing_action = (uint)data_doubles[0]._2_1_;
    SVar4 = Depth;
    if (!lacks_scoring_metric) {
      read_bytes<unsigned_char>(data_doubles,1,in);
      SVar4 = (ScoringMetric)data_doubles[0]._0_1_;
    }
    model->scoring_metric = SVar4;
    read_bytes<double,double>(data_doubles,2,in,buffer,diff_endian);
    model->exp_avg_depth =
         (double)CONCAT44(data_doubles[0]._4_4_,
                          CONCAT13(data_doubles[0]._3_1_,
                                   CONCAT12(data_doubles[0]._2_1_,
                                            CONCAT11(data_doubles[0]._1_1_,data_doubles[0]._0_1_))))
    ;
    model->exp_avg_sep = data_doubles[1];
    read_bytes<unsigned_long,unsigned_int>(data_sizets,2,in,buffer,diff_endian);
    model->orig_sample_size = data_sizets[0];
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::resize(&model->trees,data_sizets[1]);
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::_M_shrink_to_fit(&model->trees);
    pvVar2 = (model->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this = (model->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != pvVar2; this = this + 1) {
      read_bytes<unsigned_long,unsigned_int>(&veclen,1,in,buffer,diff_endian);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::resize(this,veclen);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::_M_shrink_to_fit(this);
      pIVar3 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (node_00 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                     super__Vector_impl_data._M_start; node_00 != pIVar3; node_00 = node_00 + 1) {
        deserialize_node<_IO_FILE*,short,unsigned_int>(node_00,in,buffer,diff_endian);
      }
    }
  }
  return;
}

Assistant:

void deserialize_model(IsoForest &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    if (lacks_range_penalty)
    {
        uint8_t data_en[3];
        read_bytes<uint8_t>((void*)data_en, (size_t)3, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
    }

    else
    {
        uint8_t data_en[4];
        read_bytes<uint8_t>((void*)data_en, (size_t)4, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
        model.has_range_penalty = (bool)data_en[3];
    }

    if (lacks_scoring_metric)
    {
        model.scoring_metric = Depth;
    }

    else
    {
        uint8_t data_en;
        read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
        model.scoring_metric = (ScoringMetric)data_en;
    }

    double data_doubles[2];
    read_bytes<double, double>((void*)data_doubles, (size_t)2, in, buffer, diff_endian);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)2, in, buffer, diff_endian);
    model.orig_sample_size = data_sizets[0];
    model.trees.resize(data_sizets[1]);
    model.trees.shrink_to_fit();

    size_t veclen;
    for (auto &tree : model.trees) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer, diff_endian);
    }
}